

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O1

void Msat_ClauseCalcReason
               (Msat_Solver_t *p,Msat_Clause_t *pC,Msat_Lit_t Lit,Msat_IntVec_t *vLits_out)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  
  Msat_IntVecClear(vLits_out);
  if ((Lit != -2) && (pC[1].Num != Lit)) {
    __assert_fail("Lit == MSAT_LIT_UNASSIGNED || Lit == pC->pData[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                  ,0x1a7,
                  "void Msat_ClauseCalcReason(Msat_Solver_t *, Msat_Clause_t *, Msat_Lit_t, Msat_IntVec_t *)"
                 );
  }
  uVar2 = *(uint *)&pC->field_0x4;
  if ((uint)(Lit != -2) < (uVar2 >> 3 & 0x3fff)) {
    uVar3 = (ulong)(Lit != -2);
    do {
      piVar1 = Msat_SolverReadAssignsArray(p);
      uVar2 = (&pC[1].Num)[uVar3] ^ 1;
      if (piVar1[(&pC[1].Num)[uVar3] >> 1] != uVar2) {
        __assert_fail("Msat_SolverReadAssignsArray(p)[MSAT_LIT2VAR(pC->pData[i])] == MSAT_LITNOT(pC->pData[i])"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                      ,0x1aa,
                      "void Msat_ClauseCalcReason(Msat_Solver_t *, Msat_Clause_t *, Msat_Lit_t, Msat_IntVec_t *)"
                     );
      }
      Msat_IntVecPush(vLits_out,uVar2);
      uVar3 = uVar3 + 1;
      uVar2 = *(uint *)&pC->field_0x4;
    } while (uVar3 < (uVar2 >> 3 & 0x3fff));
  }
  if ((uVar2 & 1) == 0) {
    return;
  }
  Msat_SolverClaBumpActivity(p,pC);
  return;
}

Assistant:

void Msat_ClauseCalcReason( Msat_Solver_t * p, Msat_Clause_t * pC, Msat_Lit_t Lit, Msat_IntVec_t * vLits_out )
{
    int i;
    // clear the reason
    Msat_IntVecClear( vLits_out );
    assert( Lit == MSAT_LIT_UNASSIGNED || Lit == pC->pData[0] );
    for ( i = (Lit != MSAT_LIT_UNASSIGNED); i < (int)pC->nSize; i++ )
    {
        assert( Msat_SolverReadAssignsArray(p)[MSAT_LIT2VAR(pC->pData[i])] == MSAT_LITNOT(pC->pData[i]) );
        Msat_IntVecPush( vLits_out, MSAT_LITNOT(pC->pData[i]) );
    }
    if ( pC->fLearned ) 
        Msat_SolverClaBumpActivity( p, pC );
}